

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void linkSymToSect(Symbol *symbol,Section *section)

{
  Symbol *pSVar1;
  uint uVar2;
  uint local_34;
  Symbol *pSStack_30;
  uint32_t i;
  Symbol *tmp;
  uint local_20;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  Section *section_local;
  Symbol *symbol_local;
  
  c = 0;
  uVar2 = section->nbSymbols;
  while (local_20 = uVar2, c != local_20) {
    uVar2 = c + local_20 >> 1;
    if ((section->symbols[uVar2]->field_6).offset <= (symbol->field_6).offset) {
      c = uVar2 + 1;
      uVar2 = local_20;
    }
  }
  pSStack_30 = symbol;
  for (local_34 = c; local_34 <= section->nbSymbols; local_34 = local_34 + 1) {
    pSVar1 = section->symbols[local_34];
    section->symbols[local_34] = pSStack_30;
    pSStack_30 = pSVar1;
  }
  section->nbSymbols = section->nbSymbols + 1;
  return;
}

Assistant:

static void linkSymToSect(struct Symbol *symbol, struct Section *section)
{
	uint32_t a = 0, b = section->nbSymbols;

	while (a != b) {
		uint32_t c = (a + b) / 2;

		if (section->symbols[c]->offset > symbol->offset)
			b = c;
		else
			a = c + 1;
	}

	struct Symbol *tmp = symbol;

	for (uint32_t i = a; i <= section->nbSymbols; i++) {
		symbol = tmp;
		tmp = section->symbols[i];
		section->symbols[i] = symbol;
	}

	section->nbSymbols++;
}